

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O2

int decompress_data(j_decompress_ptr cinfo,JSAMPIMAGE output_buf)

{
  JDIMENSION JVar1;
  jpeg_d_coef_controller *pjVar2;
  inverse_DCT_method_ptr p_Var3;
  int iVar4;
  JBLOCKARRAY ppaJVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  JSAMPARRAY ppJVar10;
  JDIMENSION JVar11;
  JBLOCKROW paJVar12;
  jpeg_component_info *pjVar13;
  
  pjVar2 = cinfo->coef;
  JVar1 = cinfo->total_iMCU_rows;
  while ((cinfo->input_scan_number < cinfo->output_scan_number ||
         ((cinfo->input_scan_number == cinfo->output_scan_number &&
          (cinfo->input_iMCU_row <= cinfo->output_iMCU_row))))) {
    iVar4 = (*cinfo->inputctl->consume_input)(cinfo);
    if (iVar4 == 0) {
      return 0;
    }
  }
  pjVar13 = cinfo->comp_info;
  for (lVar7 = 0; lVar7 < cinfo->num_components; lVar7 = lVar7 + 1) {
    if (pjVar13->component_needed != 0) {
      ppaJVar5 = (*cinfo->mem->access_virt_barray)
                           ((j_common_ptr)cinfo,
                            (jvirt_barray_ptr)(&pjVar2[3].start_output_pass)[lVar7],
                            cinfo->output_iMCU_row * pjVar13->v_samp_factor,pjVar13->v_samp_factor,0
                           );
      if (cinfo->output_iMCU_row < JVar1 - 1) {
        uVar8 = pjVar13->v_samp_factor;
      }
      else {
        uVar8 = pjVar13->height_in_blocks % (uint)pjVar13->v_samp_factor;
        if (uVar8 == 0) {
          uVar8 = pjVar13->v_samp_factor;
        }
      }
      p_Var3 = cinfo->idct->inverse_DCT[lVar7];
      ppJVar10 = output_buf[lVar7];
      if ((int)uVar8 < 1) {
        uVar8 = 0;
      }
      for (uVar6 = 0; uVar6 != uVar8; uVar6 = uVar6 + 1) {
        paJVar12 = ppaJVar5[uVar6];
        JVar11 = 0;
        for (uVar9 = 0; uVar9 < pjVar13->width_in_blocks; uVar9 = uVar9 + 1) {
          (*p_Var3)(cinfo,pjVar13,*paJVar12,ppJVar10,JVar11);
          paJVar12 = paJVar12 + 1;
          JVar11 = JVar11 + pjVar13->DCT_h_scaled_size;
        }
        ppJVar10 = ppJVar10 + pjVar13->DCT_v_scaled_size;
      }
    }
    pjVar13 = pjVar13 + 1;
  }
  uVar8 = cinfo->output_iMCU_row + 1;
  cinfo->output_iMCU_row = uVar8;
  return 4 - (uint)(uVar8 < cinfo->total_iMCU_rows);
}

Assistant:

METHODDEF(int)
decompress_data (j_decompress_ptr cinfo, JSAMPIMAGE output_buf)
{
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  JDIMENSION block_num;
  int ci, block_row, block_rows;
  JBLOCKARRAY buffer;
  JBLOCKROW buffer_ptr;
  JSAMPARRAY output_ptr;
  JDIMENSION output_col;
  jpeg_component_info *compptr;
  inverse_DCT_method_ptr inverse_DCT;

  /* Force some input to be done if we are getting ahead of the input. */
  while (cinfo->input_scan_number < cinfo->output_scan_number ||
	 (cinfo->input_scan_number == cinfo->output_scan_number &&
	  cinfo->input_iMCU_row <= cinfo->output_iMCU_row)) {
    if ((*cinfo->inputctl->consume_input)(cinfo) == JPEG_SUSPENDED)
      return JPEG_SUSPENDED;
  }

  /* OK, output from the virtual arrays. */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Don't bother to IDCT an uninteresting component. */
    if (! compptr->component_needed)
      continue;
    /* Align the virtual buffer for this component. */
    buffer = (*cinfo->mem->access_virt_barray)
      ((j_common_ptr) cinfo, coef->whole_image[ci],
       cinfo->output_iMCU_row * compptr->v_samp_factor,
       (JDIMENSION) compptr->v_samp_factor, FALSE);
    /* Count non-dummy DCT block rows in this iMCU row. */
    if (cinfo->output_iMCU_row < last_iMCU_row)
      block_rows = compptr->v_samp_factor;
    else {
      /* NB: can't use last_row_height here; it is input-side-dependent! */
      block_rows = (int) (compptr->height_in_blocks % compptr->v_samp_factor);
      if (block_rows == 0) block_rows = compptr->v_samp_factor;
    }
    inverse_DCT = cinfo->idct->inverse_DCT[ci];
    output_ptr = output_buf[ci];
    /* Loop over all DCT blocks to be processed. */
    for (block_row = 0; block_row < block_rows; block_row++) {
      buffer_ptr = buffer[block_row];
      output_col = 0;
      for (block_num = 0; block_num < compptr->width_in_blocks; block_num++) {
	(*inverse_DCT) (cinfo, compptr, (JCOEFPTR) buffer_ptr,
			output_ptr, output_col);
	buffer_ptr++;
	output_col += compptr->DCT_h_scaled_size;
      }
      output_ptr += compptr->DCT_v_scaled_size;
    }
  }

  if (++(cinfo->output_iMCU_row) < cinfo->total_iMCU_rows)
    return JPEG_ROW_COMPLETED;
  return JPEG_SCAN_COMPLETED;
}